

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O1

void anon_unknown.dwarf_3166b7::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int w,int h,int xs,int ys,int dx,int dy)

{
  float fVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  _Alloc_hider __filename;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  Compression *pCVar13;
  undefined4 *puVar14;
  char *pcVar15;
  int *piVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  float *pfVar22;
  float *pfVar23;
  _Rb_tree_node_base *p_Var24;
  _Rb_tree_node_base *p_Var25;
  _Rb_tree_node_base *p_Var26;
  void *pvVar27;
  half *phVar28;
  char *pcVar29;
  char *pcVar30;
  undefined4 uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  void *pvVar39;
  char *pcVar40;
  uint uVar41;
  void *pvVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  char *pcVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  Compression local_23c;
  long local_238;
  TiledInputFile in;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  char *local_1f0;
  FrameBuffer fb;
  int local_1b0;
  void *local_190;
  long local_188;
  int local_168;
  long local_160;
  void *local_158;
  Header hdr;
  long local_d8;
  string filename;
  TiledOutputFile out;
  int iStack_a4;
  undefined8 uStack_a0;
  Array2D<Imath_3_2::half> ph4;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename);
  lVar10 = (long)-h;
  lVar11 = (long)-w;
  local_23c = NO_COMPRESSION;
  do {
    __filename._M_p = filename._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar12 = (ostream *)std::ostream::operator<<(&std::cout,local_23c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    std::ostream::flush();
    _out = 0;
    _in = 0;
    fb._map._M_t._M_impl._0_4_ = w;
    fb._map._M_t._M_impl._4_4_ = h;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = w + 0xaa;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = h + 0x3a;
    Imf_3_4::Header::Header
              (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&in,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pCVar13 = (Compression *)Imf_3_4::Header::compression();
    *pCVar13 = local_23c;
    puVar14 = (undefined4 *)Imf_3_4::Header::lineOrder();
    *puVar14 = 0;
    pcVar15 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar15,(Channel *)0x1c412c);
    pcVar15 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar15,(Channel *)0x1c412f);
    pcVar15 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar15,(Channel *)0x1c4132);
    _out = 0xf0000000f;
    uStack_a0 = 0;
    Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,UINT,(char *)(pi->_data + pi->_sizeY * lVar10 + lVar11),4,0x2ac,1,1,0.0
               ,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412c);
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph->_data + ph->_sizeY * lVar10 + lVar11),2,0x156,1,1,0.0
               ,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412f);
    Imf_3_4::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)(pf->_data + pf->_sizeY * lVar10 + lVar11),4,0x2ac,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c4132);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
    std::ostream::flush();
    remove(__filename._M_p);
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledOutputFile::TiledOutputFile(&out,__filename._M_p,&hdr,iVar7);
    Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
    iVar9 = (int)(Channel *)&out;
    iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
    iVar8 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
    Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar7 + -1,0,iVar8 + -1);
    Imf_3_4::TiledOutputFile::~TiledOutputFile(&out);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (whole file)",0x16);
    std::ostream::flush();
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledInputFile::TiledInputFile(&in,__filename._M_p,iVar7);
    Imf_3_4::TiledInputFile::header();
    piVar16 = (int *)Imf_3_4::Header::dataWindow();
    iVar7 = piVar16[2];
    lVar32 = (long)*piVar16;
    uVar43 = (iVar7 - lVar32) + 1;
    iVar8 = piVar16[1];
    lVar33 = (long)piVar16[3] - (long)iVar8;
    uVar37 = lVar33 + 1;
    uVar47 = uVar37 * uVar43;
    uVar36 = -(ulong)(uVar47 >> 0x3e != 0) | uVar47 * 4;
    pvVar17 = operator_new__(uVar36);
    uVar44 = uVar47 * 2;
    if ((long)uVar47 < 0) {
      uVar44 = 0xffffffffffffffff;
    }
    pvVar18 = operator_new__(uVar44);
    pvVar19 = operator_new__(uVar36);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar38 = -(long)iVar8 * uVar43;
    uVar44 = uVar43 * 4;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,UINT,(char *)((long)pvVar17 + lVar32 * -4 + lVar38 * 4),4,uVar44,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412c);
    uVar36 = uVar43 * 2;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)((long)pvVar18 + lVar32 * -2 + lVar38 * 2),2,uVar36,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412f);
    Imf_3_4::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)((long)pvVar19 + lVar32 * -4 + lVar38 * 4),4,uVar44,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c4132);
    Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
    iVar8 = Imf_3_4::TiledInputFile::numXTiles((int)&in);
    iVar9 = Imf_3_4::TiledInputFile::numYTiles((int)&in);
    uVar31 = 0;
    Imf_3_4::TiledInputFile::readTiles((int)&in,0,iVar8 + -1,0,iVar9 + -1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", comparing (whole file)",0x18);
    std::ostream::flush();
    Imf_3_4::TiledInputFile::header();
    puVar20 = (undefined8 *)Imf_3_4::Header::displayWindow();
    puVar21 = (undefined8 *)Imf_3_4::Header::displayWindow();
    iVar8 = -(uint)((int)*puVar21 == (int)*puVar20);
    iVar9 = -(uint)((int)((ulong)*puVar21 >> 0x20) == (int)((ulong)*puVar20 >> 0x20));
    auVar51._4_4_ = iVar8;
    auVar51._0_4_ = iVar8;
    auVar51._8_4_ = iVar9;
    auVar51._12_4_ = iVar9;
    iVar8 = movmskpd(uVar31,auVar51);
    if ((iVar8 != 3) ||
       (iVar9 = -(uint)((int)puVar21[1] == (int)puVar20[1]),
       iVar59 = -(uint)((int)((ulong)puVar21[1] >> 0x20) == (int)((ulong)puVar20[1] >> 0x20)),
       auVar52._4_4_ = iVar9, auVar52._0_4_ = iVar9, auVar52._8_4_ = iVar59, auVar52._12_4_ = iVar59
       , iVar9 = movmskpd((int)puVar21,auVar52), iVar9 != 3)) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10a,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    puVar20 = (undefined8 *)Imf_3_4::Header::dataWindow();
    puVar21 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar9 = -(uint)((int)*puVar21 == (int)*puVar20);
    iVar59 = -(uint)((int)((ulong)*puVar21 >> 0x20) == (int)((ulong)*puVar20 >> 0x20));
    auVar53._4_4_ = iVar9;
    auVar53._0_4_ = iVar9;
    auVar53._8_4_ = iVar59;
    auVar53._12_4_ = iVar59;
    iVar8 = movmskpd(iVar8,auVar53);
    if ((iVar8 != 3) ||
       (iVar8 = -(uint)((int)puVar21[1] == (int)puVar20[1]),
       iVar9 = -(uint)((int)((ulong)puVar21[1] >> 0x20) == (int)((ulong)puVar20[1] >> 0x20)),
       auVar54._4_4_ = iVar8, auVar54._0_4_ = iVar8, auVar54._8_4_ = iVar9, auVar54._12_4_ = iVar9,
       iVar8 = movmskpd((int)puVar21,auVar54), iVar8 != 3)) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    pfVar22 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar1 = *pfVar22;
    pfVar22 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar22) || (NAN(fVar1) || NAN(*pfVar22))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    pfVar22 = (float *)Imf_3_4::Header::screenWindowCenter();
    pfVar23 = (float *)Imf_3_4::Header::screenWindowCenter();
    if ((((*pfVar22 != *pfVar23) || (NAN(*pfVar22) || NAN(*pfVar23))) || (pfVar22[1] != pfVar23[1]))
       || (NAN(pfVar22[1]) || NAN(pfVar23[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10e,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    pfVar22 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar1 = *pfVar22;
    pfVar22 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar1 != *pfVar22) || (NAN(fVar1) || NAN(*pfVar22))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10f,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    piVar16 = (int *)Imf_3_4::Header::lineOrder();
    iVar8 = *piVar16;
    piVar16 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar8 != *piVar16) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x110,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    piVar16 = (int *)Imf_3_4::Header::compression();
    iVar8 = *piVar16;
    piVar16 = (int *)Imf_3_4::Header::compression();
    if (iVar8 != *piVar16) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x111,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::Header::channels();
    p_Var24 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
    Imf_3_4::TiledInputFile::header();
    Imf_3_4::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
    while( true ) {
      Imf_3_4::Header::channels();
      p_Var26 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      if (p_Var24 == p_Var26) break;
      iVar8 = strcmp((char *)(p_Var24 + 1),(char *)(p_Var25 + 1));
      if (iVar8 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x118,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var24[9]._M_color != p_Var25[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x119,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var24[9].field_0x4 != *(int *)&p_Var25[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var24[9]._M_parent != *(int *)&p_Var25[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
    }
    Imf_3_4::TiledInputFile::header();
    Imf_3_4::Header::channels();
    p_Var24 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var25 != p_Var24) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x121,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    uVar47 = uVar37 & 0xffffffff;
    local_168 = (int)lVar33;
    local_1b0 = (int)(iVar7 - lVar32);
    if ((PXR24_COMPRESSION < local_23c) && (-1 < local_168)) {
      local_d8 = 0;
      local_160 = 0;
      local_158 = pvVar18;
      do {
        uVar35 = (uint)uVar37;
        uVar46 = 0xf;
        if ((int)uVar35 < 0xf) {
          uVar46 = uVar35;
        }
        if ((int)uVar46 < 2) {
          uVar46 = 1;
        }
        if (-1 < local_1b0) {
          lVar32 = uVar47 - local_160;
          iVar8 = (int)lVar32;
          iVar7 = 0xf;
          if (iVar8 < 0xf) {
            iVar7 = iVar8;
          }
          lVar33 = (long)iVar7;
          local_188 = 0;
          local_190 = local_158;
          uVar37 = uVar43 & 0xffffffff;
          lVar38 = 0;
          do {
            uVar41 = (uint)uVar37;
            lVar48 = 0xf;
            if ((long)(int)uVar41 < 0xf) {
              lVar48 = (long)(int)uVar41;
            }
            uVar50 = 0xf;
            if ((int)uVar41 < 0xf) {
              uVar50 = uVar41;
            }
            if ((int)uVar50 < 2) {
              uVar50 = 1;
            }
            iVar9 = (int)(uVar43 - lVar38);
            iVar8 = 0xf;
            if (iVar9 < 0xf) {
              iVar8 = iVar9;
            }
            uStack_a0 = (long)iVar8;
            uVar37 = uStack_a0 * lVar33 * 2;
            if (uStack_a0 * lVar33 < 0) {
              uVar37 = 0xffffffffffffffff;
            }
            _out = lVar33;
            pvVar27 = operator_new__(uVar37);
            ph4._sizeX = lVar33;
            ph4._sizeY = uStack_a0;
            ph4._data = (half *)operator_new__(uVar37);
            if (0 < lVar32) {
              lVar3 = ph->_sizeY;
              lVar34 = (long)&ph->_data->_h + local_d8 * lVar3 + local_188;
              uVar37 = 0;
              phVar28 = ph4._data;
              pvVar39 = pvVar27;
              pvVar42 = local_190;
              do {
                if (0 < (long)(uVar43 - lVar38)) {
                  uVar45 = 0;
                  do {
                    *(undefined2 *)((long)pvVar39 + uVar45 * 2) =
                         *(undefined2 *)(lVar34 + uVar45 * 2);
                    phVar28[uVar45]._h = *(uint16_t *)((long)pvVar42 + uVar45 * 2);
                    uVar45 = uVar45 + 1;
                  } while (uVar50 != uVar45);
                }
                uVar37 = uVar37 + 1;
                phVar28 = phVar28 + lVar48;
                pvVar39 = (void *)((long)pvVar39 + lVar48 * 2);
                pvVar42 = (void *)((long)pvVar42 + uVar36);
                lVar34 = lVar34 + lVar3 * 2;
              } while (uVar37 != uVar46);
            }
            if ((local_23c & (DWAA_COMPRESSION|B44_COMPRESSION)) == B44_COMPRESSION) {
              compareB44(iVar8,iVar7,(Array2D<Imath_3_2::half> *)&out,&ph4);
            }
            if (ph4._data != (half *)0x0) {
              operator_delete__(ph4._data);
            }
            if (pvVar27 != (void *)0x0) {
              operator_delete__(pvVar27);
            }
            lVar38 = lVar38 + 0xf;
            uVar37 = (ulong)(uVar41 - 0xf);
            local_190 = (void *)((long)local_190 + 0x1e);
            local_188 = local_188 + 0x1e;
          } while ((int)lVar38 <= local_1b0);
        }
        local_160 = local_160 + 0xf;
        uVar37 = (ulong)(uVar35 - 0xf);
        local_158 = (void *)((long)local_158 + uVar43 * 0x1e);
        local_d8 = local_d8 + 0x1e;
      } while ((int)local_160 <= local_168);
    }
    if (-1 < local_168) {
      lVar32 = 0;
      local_238 = 0;
      uVar37 = 0;
      pvVar27 = pvVar18;
      pvVar39 = pvVar19;
      pvVar42 = pvVar17;
      do {
        if (-1 < local_1b0) {
          uVar45 = 0;
          do {
            if (*(int *)((long)pi->_data + uVar45 * 4 + pi->_sizeY * lVar32) !=
                *(int *)((long)pvVar42 + uVar45 * 4)) {
              __assert_fail("pi1[y][x] == pi2[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x14a,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            if ((local_23c < B44_COMPRESSION) &&
               ((fVar1 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(uint16_t *)
                                           ((long)&ph->_data[uVar45]._h + ph->_sizeY * local_238) *
                                   4),
                pfVar22 = (float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)((long)pvVar27 + uVar45 * 2) * 4),
                fVar1 != *pfVar22 || (NAN(fVar1) || NAN(*pfVar22))))) {
              __assert_fail("ph1[y][x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x14f,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            bVar6 = equivalent(*(float *)((long)pf->_data + uVar45 * 4 + pf->_sizeY * lVar32),
                               *(float *)((long)pvVar39 + uVar45 * 4),local_23c);
            if (!bVar6) {
              __assert_fail("equivalent (pf1[y][x], pf2[y][x], comp)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x152,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            uVar45 = uVar45 + 1;
          } while ((uVar43 & 0xffffffff) != uVar45);
        }
        uVar37 = uVar37 + 1;
        pvVar27 = (void *)((long)pvVar27 + uVar36);
        local_238 = local_238 + 2;
        pvVar39 = (void *)((long)pvVar39 + uVar44);
        lVar32 = lVar32 + 4;
        pvVar42 = (void *)((long)pvVar42 + uVar44);
      } while (uVar37 != uVar47);
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    operator_delete__(pvVar19);
    operator_delete__(pvVar18);
    operator_delete__(pvVar17);
    if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
    }
    if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading and comparing (tile-by-tile)",0x26);
    std::ostream::flush();
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledInputFile::TiledInputFile(&in,__filename._M_p,iVar7);
    pcVar15 = (char *)operator_new__(900);
    pcVar29 = (char *)operator_new__(0x1c2);
    pcVar30 = (char *)operator_new__(900);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar15,4,0x3c,1,1,0.0,true,true);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412c);
    Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar29,2,0x1e,1,1,0.0,true,true);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412f);
    uVar31 = 4;
    Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar30,4,0x3c,1,1,0.0,true,true);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c4132);
    Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
    Imf_3_4::TiledInputFile::header();
    puVar20 = (undefined8 *)Imf_3_4::Header::displayWindow();
    puVar21 = (undefined8 *)Imf_3_4::Header::displayWindow();
    iVar7 = -(uint)((int)*puVar21 == (int)*puVar20);
    iVar8 = -(uint)((int)((ulong)*puVar21 >> 0x20) == (int)((ulong)*puVar20 >> 0x20));
    auVar55._4_4_ = iVar7;
    auVar55._0_4_ = iVar7;
    auVar55._8_4_ = iVar8;
    auVar55._12_4_ = iVar8;
    iVar7 = movmskpd(uVar31,auVar55);
    if ((iVar7 != 3) ||
       (iVar8 = -(uint)((int)puVar21[1] == (int)puVar20[1]),
       iVar9 = -(uint)((int)((ulong)puVar21[1] >> 0x20) == (int)((ulong)puVar20[1] >> 0x20)),
       auVar56._4_4_ = iVar8, auVar56._0_4_ = iVar8, auVar56._8_4_ = iVar9, auVar56._12_4_ = iVar9,
       iVar8 = movmskpd((int)puVar21,auVar56), iVar8 != 3)) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    puVar20 = (undefined8 *)Imf_3_4::Header::dataWindow();
    puVar21 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar8 = -(uint)((int)*puVar21 == (int)*puVar20);
    iVar9 = -(uint)((int)((ulong)*puVar21 >> 0x20) == (int)((ulong)*puVar20 >> 0x20));
    auVar57._4_4_ = iVar8;
    auVar57._0_4_ = iVar8;
    auVar57._8_4_ = iVar9;
    auVar57._12_4_ = iVar9;
    iVar7 = movmskpd(iVar7,auVar57);
    if ((iVar7 != 3) ||
       (iVar7 = -(uint)((int)puVar21[1] == (int)puVar20[1]),
       iVar8 = -(uint)((int)((ulong)puVar21[1] >> 0x20) == (int)((ulong)puVar20[1] >> 0x20)),
       auVar58._4_4_ = iVar7, auVar58._0_4_ = iVar7, auVar58._8_4_ = iVar8, auVar58._12_4_ = iVar8,
       iVar7 = movmskpd((int)puVar21,auVar58), iVar7 != 3)) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    pfVar22 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar1 = *pfVar22;
    pfVar22 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar22) || (NAN(fVar1) || NAN(*pfVar22))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18d,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    pfVar22 = (float *)Imf_3_4::Header::screenWindowCenter();
    pfVar23 = (float *)Imf_3_4::Header::screenWindowCenter();
    if ((((*pfVar22 != *pfVar23) || (NAN(*pfVar22) || NAN(*pfVar23))) || (pfVar22[1] != pfVar23[1]))
       || (NAN(pfVar22[1]) || NAN(pfVar23[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,399,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    pfVar22 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar1 = *pfVar22;
    pfVar22 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar1 != *pfVar22) || (NAN(fVar1) || NAN(*pfVar22))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,400,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    piVar16 = (int *)Imf_3_4::Header::lineOrder();
    iVar7 = *piVar16;
    piVar16 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar7 != *piVar16) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x191,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    piVar16 = (int *)Imf_3_4::Header::compression();
    iVar7 = *piVar16;
    piVar16 = (int *)Imf_3_4::Header::compression();
    if (iVar7 != *piVar16) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x192,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::Header::channels();
    p_Var24 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
    Imf_3_4::TiledInputFile::header();
    Imf_3_4::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
    while( true ) {
      Imf_3_4::Header::channels();
      p_Var26 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      if (p_Var24 == p_Var26) break;
      iVar7 = strcmp((char *)(p_Var24 + 1),(char *)(p_Var25 + 1));
      if (iVar7 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x199,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var24[9]._M_color != p_Var25[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var24[9].field_0x4 != *(int *)&p_Var25[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var24[9]._M_parent != *(int *)&p_Var25[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19c,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
    }
    Imf_3_4::TiledInputFile::header();
    Imf_3_4::Header::channels();
    p_Var24 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var25 != p_Var24) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x1a2,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    iVar7 = 0;
    while( true ) {
      iVar8 = Imf_3_4::TiledInputFile::numYTiles((int)&in);
      if (iVar8 <= iVar7) break;
      iVar8 = 0;
      while( true ) {
        iVar59 = (int)&in;
        iVar9 = Imf_3_4::TiledInputFile::numXTiles(iVar59);
        if (iVar9 <= iVar8) break;
        Imf_3_4::TiledInputFile::readTile(iVar59,iVar8,iVar7);
        Imf_3_4::TiledInputFile::dataWindowForTile((int)&out,iVar59,iVar8);
        if (iStack_a4 <= uStack_a0._4_4_) {
          iVar59 = _out - w;
          local_238 = (long)(iStack_a4 - h) * 2;
          lVar33 = (long)(iStack_a4 - h) << 2;
          lVar32 = (long)iVar59 * 4;
          uVar43 = 0;
          pcVar40 = pcVar30;
          pcVar49 = pcVar15;
          iVar9 = iStack_a4;
          local_1f0 = pcVar29;
          do {
            iVar5 = _out;
            if (_out <= (int)uStack_a0) {
              uVar37 = 0;
              do {
                if (*(int *)((long)pi->_data + uVar37 * 4 + lVar32 + pi->_sizeY * lVar33) !=
                    *(int *)(pcVar49 + uVar37 * 4)) {
                  __assert_fail("pi1[oY + y][oX + x] == pi2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1b6,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                if ((local_23c < B44_COMPRESSION) &&
                   ((fVar1 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(uint16_t *)
                                               ((long)&ph->_data[(long)iVar59 + uVar37]._h +
                                               ph->_sizeY * local_238) * 4),
                    pfVar22 = (float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(local_1f0 + uVar37 * 2) * 4),
                    fVar1 != *pfVar22 || (NAN(fVar1) || NAN(*pfVar22))))) {
                  __assert_fail("ph1[oY + y][oX + x] == ph2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1bd,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                bVar6 = equivalent(*(float *)((long)pf->_data +
                                             uVar37 * 4 + lVar32 + pf->_sizeY * lVar33),
                                   *(float *)(pcVar40 + uVar37 * 4),local_23c);
                if (!bVar6) {
                  __assert_fail("equivalent (pf1[oY + y][oX + x], pf2[y][x], comp)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1c1,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
              } while ((uVar37 < 0xe) &&
                      (iVar4 = (int)uVar37, uVar37 = uVar37 + 1, iVar5 + iVar4 < (int)uStack_a0));
            }
            if (0xd < uVar43) break;
            uVar43 = uVar43 + 1;
            local_1f0 = local_1f0 + 0x1e;
            pcVar40 = pcVar40 + 0x3c;
            pcVar49 = pcVar49 + 0x3c;
            local_238 = local_238 + 2;
            lVar33 = lVar33 + 4;
            bVar6 = iVar9 < uStack_a0._4_4_;
            iVar9 = iVar9 + 1;
          } while (bVar6);
        }
        iVar8 = iVar8 + 1;
      }
      iVar7 = iVar7 + 1;
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    operator_delete__(pcVar30);
    operator_delete__(pcVar29);
    operator_delete__(pcVar15);
    if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
    }
    if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
    }
    remove(__filename._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    Imf_3_4::Header::~Header(&hdr);
    local_23c = local_23c + RLE_COMPRESSION;
    if (local_23c == NUM_COMPRESSION_METHODS) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          w,
    int                          h,
    int                          xs,
    int                          ys,
    int                          dx,
    int                          dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeRead (
            pi,
            ph,
            pf,
            filename.c_str (),
            LineOrder (0),
            w,
            h,
            xs,
            ys,
            dx,
            dy,
            Compression (comp));
    }
}